

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_ge *pk,
              secp256k1_keypair *keypair)

{
  uint uVar1;
  int iVar2;
  secp256k1_ge *ge;
  long in_RCX;
  void *in_RDX;
  uint64_t *in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_pubkey *pubkey;
  int ret;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar3;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  ge = (secp256k1_ge *)(in_RCX + 0x20);
  secp256k1_declassify(in_RDI,ge,0x40);
  uVar1 = secp256k1_pubkey_load
                    ((secp256k1_context *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),ge,
                     (secp256k1_pubkey *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (in_RSI != (uint64_t *)0x0) {
    bVar3 = false;
    if (uVar1 != 0) {
      iVar2 = secp256k1_keypair_seckey_load
                        ((secp256k1_context *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                         (secp256k1_scalar *)ge,
                         (secp256k1_keypair *)(ulong)in_stack_ffffffffffffffc8);
      bVar3 = iVar2 != 0;
    }
    uVar1 = (uint)bVar3;
  }
  if ((uVar1 == 0) && (memcpy(in_RDX,&secp256k1_ge_const_g,0x68), in_RSI != (uint64_t *)0x0)) {
    *in_RSI = 1;
    in_RSI[1] = 0;
    in_RSI[2] = 0;
    in_RSI[3] = 0;
  }
  return uVar1;
}

Assistant:

static int secp256k1_keypair_load(const secp256k1_context* ctx, secp256k1_scalar *sk, secp256k1_ge *pk, const secp256k1_keypair *keypair) {
    int ret;
    const secp256k1_pubkey *pubkey = (const secp256k1_pubkey *)&keypair->data[32];

    /* Need to declassify the pubkey because pubkey_load ARG_CHECKs if it's
     * invalid. */
    secp256k1_declassify(ctx, pubkey, sizeof(*pubkey));
    ret = secp256k1_pubkey_load(ctx, pk, pubkey);
    if (sk != NULL) {
        ret = ret && secp256k1_keypair_seckey_load(ctx, sk, keypair);
    }
    if (!ret) {
        *pk = secp256k1_ge_const_g;
        if (sk != NULL) {
            *sk = secp256k1_scalar_one;
        }
    }
    return ret;
}